

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

double __thiscall ON_HatchLine::AngleDegrees(ON_HatchLine *this)

{
  double dVar1;
  
  dVar1 = this->m_angle_radians;
  if ((0.0 <= dVar1) && (dVar1 < 6.283185307179586)) {
    dVar1 = (double)((ulong)(dVar1 * 57.29577951308232) &
                    -(ulong)(dVar1 * 57.29577951308232 < 360.0));
  }
  return dVar1;
}

Assistant:

double ON_HatchLine::AngleDegrees() const
{
  if (0.0 <= m_angle_radians && m_angle_radians < 2.0*ON_PI)
  {
    double angle_degrees = m_angle_radians*(180.0/ON_PI);
    if (angle_degrees >= 360.0)
      angle_degrees = 0.0;
    return angle_degrees;
  }
  return m_angle_radians; // UNSET VALUE OR NaN
}